

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::CentroidRenderCase::setupRenderData
          (CentroidRenderCase *this)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  reference pvVar5;
  size_type sVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  Vector<float,_4> local_1d8;
  Vector<float,_4> local_1c8;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  Vector<float,_4> local_178;
  Vector<float,_4> local_168;
  Vector<float,_4> local_158;
  float local_148;
  float local_144;
  float nextAngle;
  float angle;
  int triangleNdx;
  allocator<char> local_111;
  key_type local_110;
  allocator<char> local_e9;
  key_type local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98;
  allocator<char> local_71;
  key_type local_70;
  allocator<tcu::Vector<float,_4>_> local_39;
  undefined1 local_38 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Functions *gl;
  int numTriangles;
  CentroidRenderCase *this_local;
  
  pRVar3 = gles31::Context::getRenderContext
                     ((this->super_MultisampleRenderCase).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_39);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38,
             0x708,&local_39);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_39);
  (this->super_MultisampleRenderCase).m_renderMode = 4;
  (this->super_MultisampleRenderCase).m_renderCount = 600;
  std::__cxx11::string::operator=
            ((string *)&(this->super_MultisampleRenderCase).m_renderSceneDescription,
             "triangle fan of narrow triangles");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"a_position",&local_71);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](&(this->super_MultisampleRenderCase).m_renderAttribs,&local_70);
  pmVar4->offset = 0;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"a_position",&local_99);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](&(this->super_MultisampleRenderCase).m_renderAttribs,&local_98);
  pmVar4->stride = 0x30;
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"a_barycentricsA",&local_c1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](&(this->super_MultisampleRenderCase).m_renderAttribs,&local_c0);
  pmVar4->offset = 0x10;
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"a_barycentricsA",&local_e9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](&(this->super_MultisampleRenderCase).m_renderAttribs,&local_e8);
  pmVar4->stride = 0x30;
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"a_barycentricsB",&local_111);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](&(this->super_MultisampleRenderCase).m_renderAttribs,&local_110);
  pmVar4->offset = 0x20;
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&triangleNdx,"a_barycentricsB",(allocator<char> *)((long)&angle + 3));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](&(this->super_MultisampleRenderCase).m_renderAttribs,
                        (key_type *)&triangleNdx);
  pmVar4->stride = 0x30;
  std::__cxx11::string::~string((string *)&triangleNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&angle + 3));
  for (nextAngle = 0.0; (int)nextAngle < 200; nextAngle = (float)((int)nextAngle + 1)) {
    local_144 = ((float)(int)nextAngle / 200.0 + (float)(int)nextAngle / 200.0) * 3.1415927;
    fVar8 = ((float)(int)nextAngle + 1.0) / 200.0;
    local_148 = (fVar8 + fVar8) * 3.1415927;
    tcu::Vector<float,_4>::Vector(&local_158,0.2,-0.3,0.0,1.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9));
    *(undefined8 *)pvVar5->m_data = local_158.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_158.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_168,1.0,0.0,0.0,0.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9 + 1));
    *(undefined8 *)pvVar5->m_data = local_168.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_168.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_178,1.0,0.0,0.0,0.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9 + 2));
    *(undefined8 *)pvVar5->m_data = local_178.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_178.m_data._8_8_;
    fVar8 = ::deFloatCos(local_144);
    fVar9 = ::deFloatSin(local_144);
    tcu::Vector<float,_4>::Vector(&local_188,fVar8 + fVar8,fVar9 + fVar9,0.0,1.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9 + 3));
    *(undefined8 *)pvVar5->m_data = local_188.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_188.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_198,0.0,1.0,0.0,0.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9 + 4));
    *(undefined8 *)pvVar5->m_data = local_198.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_198.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_1a8,0.0,1.0,0.0,0.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9 + 5));
    *(undefined8 *)pvVar5->m_data = local_1a8.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_1a8.m_data._8_8_;
    fVar8 = ::deFloatCos(local_148);
    fVar9 = ::deFloatSin(local_148);
    tcu::Vector<float,_4>::Vector(&local_1b8,fVar8 + fVar8,fVar9 + fVar9,0.0,1.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9 + 6));
    *(undefined8 *)pvVar5->m_data = local_1b8.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_1b8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_1c8,0.0,0.0,1.0,0.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)((int)nextAngle * 9 + 7));
    *(undefined8 *)pvVar5->m_data = local_1c8.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_1c8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_1d8,0.0,0.0,1.0,0.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_38,(long)(((int)nextAngle * 3 + 2) * 3 + 2));
    *(undefined8 *)pvVar5->m_data = local_1d8.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_1d8.m_data._8_8_;
  }
  (**(code **)data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[4].m_data)
            (0x8892,(this->super_MultisampleRenderCase).m_buffer);
  pcVar1 = *(code **)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0x15].m_data;
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     local_38);
  pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_38,0);
  pfVar7 = tcu::Vector<float,_4>::getPtr(pvVar5);
  (*pcVar1)(0x8892,sVar6 << 4,pfVar7,0x88e4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38);
  return;
}

Assistant:

void CentroidRenderCase::setupRenderData (void)
{
	const int				numTriangles	= 200;
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	std::vector<tcu::Vec4>	data			(numTriangles * 3 * 3);

	m_renderMode = GL_TRIANGLES;
	m_renderCount = numTriangles * 3;
	m_renderSceneDescription = "triangle fan of narrow triangles";

	m_renderAttribs["a_position"].offset = 0;
	m_renderAttribs["a_position"].stride = (int)sizeof(float[4]) * 3;
	m_renderAttribs["a_barycentricsA"].offset = (int)sizeof(float[4]);
	m_renderAttribs["a_barycentricsA"].stride = (int)sizeof(float[4]) * 3;
	m_renderAttribs["a_barycentricsB"].offset = (int)sizeof(float[4]) * 2;
	m_renderAttribs["a_barycentricsB"].stride = (int)sizeof(float[4]) * 3;

	for (int triangleNdx = 0; triangleNdx < numTriangles; ++triangleNdx)
	{
		const float angle		= ((float)triangleNdx) / (float)numTriangles * 2.0f * DE_PI;
		const float nextAngle	= ((float)triangleNdx + 1.0f) / (float)numTriangles * 2.0f * DE_PI;

		data[(triangleNdx * 3 + 0) * 3 + 0] = tcu::Vec4(0.2f, -0.3f, 0.0f, 1.0f);
		data[(triangleNdx * 3 + 0) * 3 + 1] = tcu::Vec4(1.0f,  0.0f, 0.0f, 0.0f);
		data[(triangleNdx * 3 + 0) * 3 + 2] = tcu::Vec4(1.0f,  0.0f, 0.0f, 0.0f);

		data[(triangleNdx * 3 + 1) * 3 + 0] = tcu::Vec4(2.0f * deFloatCos(angle), 2.0f * deFloatSin(angle), 0.0f, 1.0f);
		data[(triangleNdx * 3 + 1) * 3 + 1] = tcu::Vec4(0.0f,  1.0f, 0.0f, 0.0f);
		data[(triangleNdx * 3 + 1) * 3 + 2] = tcu::Vec4(0.0f,  1.0f, 0.0f, 0.0f);

		data[(triangleNdx * 3 + 2) * 3 + 0] = tcu::Vec4(2.0f * deFloatCos(nextAngle), 2.0f * deFloatSin(nextAngle), 0.0f, 1.0f);
		data[(triangleNdx * 3 + 2) * 3 + 1] = tcu::Vec4(0.0f,  0.0f, 1.0f, 0.0f);
		data[(triangleNdx * 3 + 2) * 3 + 2] = tcu::Vec4(0.0f,  0.0f, 1.0f, 0.0f);
	}

	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(data.size() * sizeof(tcu::Vec4)), data[0].getPtr(), GL_STATIC_DRAW);
}